

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

int Cudd_SharingSize(DdNode **nodeArray,int n)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar4;
  }
  iVar3 = 0;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = ddDagInt((DdNode *)((ulong)nodeArray[uVar4] & 0xfffffffffffffffe));
    iVar3 = iVar3 + iVar1;
  }
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    ddClearFlag((DdNode *)((ulong)nodeArray[uVar4] & 0xfffffffffffffffe));
  }
  return iVar3;
}

Assistant:

int
Cudd_SharingSize(
  DdNode ** nodeArray,
  int  n)
{
    int i,j;

    i = 0;
    for (j = 0; j < n; j++) {
        i += ddDagInt(Cudd_Regular(nodeArray[j]));
    }
    for (j = 0; j < n; j++) {
        ddClearFlag(Cudd_Regular(nodeArray[j]));
    }
    return(i);

}